

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int extraout_EDX;
  sigaction sa;
  string local_f8;
  string local_d8;
  sigaction local_b8;
  
  progname = *argv;
  iVar1 = getopt(argc,argv,"vh");
  if (iVar1 == -1) {
    memset(&local_b8,0,0x98);
    sigemptyset(&local_b8.sa_mask);
    local_b8.__sigaction_handler.sa_handler = segfault_sigaction;
    local_b8.sa_flags = 4;
    sigaction(0xb,&local_b8,(sigaction *)0x0);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    initstreams(&local_d8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    amplificationstocsv::DoIt();
    return 0;
  }
  if (iVar1 == 0x76) {
    main_cold_1();
  }
  main_cold_3();
  if (extraout_EDX == 1) {
    main_cold_2();
  }
  _Unwind_Resume();
}

Assistant:

int main(int argc, char *argv[]) {

  int opt;
  progname = argv[0];
  while ((opt = getopt(argc, argv, "vh")) != -1) {
    switch (opt) {
      case 'v':
        fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
        exit(EXIT_FAILURE);
        break;
      case 'h':
      default:
        help();
        exit(EXIT_FAILURE);
    }
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    initstreams();
    amplificationstocsv::DoIt();
  } catch (std::bad_alloc&) {
    fprintf(stderr, "FATAL: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);
  }

}